

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QObject_*,_QString>::emplaceValue<QString>
          (Node<QObject_*,_QString> *this,QString *args)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = (args->d).size;
  (args->d).size = 0;
  pDVar2 = (args->d).d;
  pcVar3 = (args->d).ptr;
  (args->d).d = (Data *)0x0;
  (args->d).ptr = (char16_t *)0x0;
  local_28.d = (this->value).d.d;
  local_28.ptr = (this->value).d.ptr;
  (this->value).d.d = pDVar2;
  (this->value).d.ptr = pcVar3;
  local_28.size = (this->value).d.size;
  (this->value).d.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }